

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void rgba_5551_to_abgr_f32
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  ushort uVar1;
  undefined8 *puVar2;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  ALLEGRO_COLOR AVar3;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  ALLEGRO_COLOR *dst_end;
  int dst_gap;
  int src_gap;
  ALLEGRO_COLOR *dst_ptr;
  uint16_t *src_ptr;
  int y;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 *local_38;
  ushort *local_30;
  int local_28;
  
  local_30 = (ushort *)(in_RDI + in_R9D * in_ESI + (long)in_R8D * 2);
  local_38 = (undefined8 *)(in_RDX + in_stack_00000010 * in_ECX + (long)in_stack_00000008 * 0x10);
  for (local_28 = 0; local_28 < (int)dst_end; local_28 = local_28 + 1) {
    puVar2 = local_38 + (long)in_stack_00000018 * 2;
    for (; local_38 < puVar2; local_38 = local_38 + 2) {
      uVar1 = *local_30;
      AVar3 = al_map_rgba((uchar)_al_rgb_scale_5[uVar1 >> 0xb],
                          *(uchar *)((long)_al_rgb_scale_5 + (ulong)(uVar1 >> 4 & 0x7c)),
                          *(uchar *)((long)_al_rgb_scale_5 + (ulong)(uVar1 & 0x3e) * 2),
                          (uchar)_al_rgb_scale_1[uVar1 & 1]);
      local_58 = AVar3._0_8_;
      *local_38 = local_58;
      local_50 = AVar3._8_8_;
      local_38[1] = local_50;
      local_30 = local_30 + 1;
    }
    local_30 = local_30 + (in_ESI / 2 - in_stack_00000018);
    local_38 = local_38 + (long)(in_ECX / 0x10 - in_stack_00000018) * 2;
  }
  return;
}

Assistant:

static void rgba_5551_to_abgr_f32(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   ALLEGRO_COLOR *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 16 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      ALLEGRO_COLOR *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_RGBA_5551_TO_ABGR_F32(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}